

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

string * __thiscall
Json::ValueIteratorBase::name_abi_cxx11_(string *__return_storage_ptr__,ValueIteratorBase *this)

{
  _Base_ptr p_Var1;
  long lVar2;
  long lVar3;
  
  p_Var1 = (this->current_)._M_node;
  lVar3 = *(long *)(p_Var1 + 1);
  if (lVar3 == 0) {
    lVar2 = 0;
    lVar3 = 0;
  }
  else {
    lVar2 = (ulong)(*(uint *)&p_Var1[1]._M_parent >> 2) + lVar3;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (lVar3 == 0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,lVar3,lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING ValueIteratorBase::name() const {
  char const* keey;
  char const* end;
  keey = memberName(&end);
  if (!keey) return JSONCPP_STRING();
  return JSONCPP_STRING(keey, end);
}